

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShutDownRestartTest.cpp
# Opt level: O3

int ShutDownRestartTest(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  EStatusCode EVar3;
  LogConfiguration *pLVar4;
  EncryptionOptions *pEVar5;
  PDFPage *pPVar6;
  PDFUsedFont *inFontReference;
  PageContentContext *pPVar7;
  PDFFormXObject *this;
  ObjectIDType inFormXObjectID;
  XObjectContentContext *this_00;
  ResourcesDictionary *this_01;
  string *inOptionalModifiedFile;
  int extraout_EDX;
  int extraout_EDX_00;
  long lVar8;
  int iVar9;
  PageContentContext *pPVar10;
  char *pcVar11;
  string *inXObjectName;
  PDFCreationSettings *inPDFCreationSettings;
  int in_R9D;
  string formXObjectName;
  PDFWriter pdfWriterA;
  string local_1010;
  string local_ff0;
  string local_fd0;
  undefined1 local_fb0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f90;
  _Alloc_hider local_f78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f68;
  string local_f50;
  undefined1 local_f30 [8];
  _Alloc_hider local_f28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f18;
  longlong local_f08;
  _Alloc_hider local_f00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ef0;
  PDFWriter local_ee0;
  
  PDFWriter::PDFWriter(&local_ee0);
  local_1010._M_dataplus._M_p = (pointer)&local_1010.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1010,"SimpleContentShutdownRestart.pdf","");
  BuildRelativeOutputPath(&local_ff0,(char **)argv[2],&local_1010);
  pLVar4 = LogConfiguration::DefaultLogConfiguration();
  pEVar5 = EncryptionOptions::DefaultEncryptionOptions();
  local_f30[0] = pEVar5->ShouldEncrypt;
  pcVar2 = (pEVar5->UserPassword)._M_dataplus._M_p;
  local_f28._M_p = (pointer)&local_f18;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f28,pcVar2,pcVar2 + (pEVar5->UserPassword)._M_string_length);
  local_f08 = pEVar5->UserProtectionOptionsFlag;
  pcVar2 = (pEVar5->OwnerPassword)._M_dataplus._M_p;
  local_f00._M_p = (pointer)&local_ef0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f00,pcVar2,pcVar2 + (pEVar5->OwnerPassword)._M_string_length);
  PDFCreationSettings::PDFCreationSettings
            ((PDFCreationSettings *)local_fb0,true,true,(EncryptionOptions *)local_f30,false);
  inPDFCreationSettings = (PDFCreationSettings *)local_fb0;
  EVar3 = PDFWriter::StartPDF(&local_ee0,&local_ff0,ePDFVersion13,pLVar4,inPDFCreationSettings);
  iVar9 = (int)inPDFCreationSettings;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f78._M_p != &local_f68) {
    operator_delete(local_f78._M_p,local_f68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fb0._16_8_ != &local_f90) {
    operator_delete((void *)local_fb0._16_8_,local_f90._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f00._M_p != &local_ef0) {
    operator_delete(local_f00._M_p,local_ef0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f28._M_p != &local_f18) {
    operator_delete(local_f28._M_p,local_f18._M_allocated_capacity + 1);
  }
  paVar1 = &local_ff0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ff0._M_dataplus._M_p != paVar1) {
    operator_delete(local_ff0._M_dataplus._M_p,local_ff0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1010._M_dataplus._M_p != &local_1010.field_2) {
    operator_delete(local_1010._M_dataplus._M_p,local_1010.field_2._M_allocated_capacity + 1);
  }
  if (EVar3 != eSuccess) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"failed to start PDF\n",0x14);
    goto LAB_001513eb;
  }
  pPVar6 = (PDFPage *)operator_new(0x2b8);
  PDFPage::PDFPage(pPVar6);
  PDFRectangle::PDFRectangle((PDFRectangle *)local_fb0,0.0,0.0,595.0,842.0);
  PDFPage::SetMediaBox(pPVar6,(PDFRectangle *)local_fb0);
  PDFRectangle::~PDFRectangle((PDFRectangle *)local_fb0);
  local_fd0._M_dataplus._M_p = (pointer)&local_fd0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_fd0,"fonts/arial.ttf","");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ff0,argv[1],(allocator<char> *)&local_f50);
  LocalPathToFileURL((FileURL *)local_fb0,&local_ff0);
  RelativeURLToLocalPath(&local_1010,(FileURL *)local_fb0,&local_fd0);
  FileURL::~FileURL((FileURL *)local_fb0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ff0._M_dataplus._M_p != paVar1) {
    operator_delete(local_ff0._M_dataplus._M_p,local_ff0.field_2._M_allocated_capacity + 1);
  }
  inFontReference = PDFWriter::GetFontForFile(&local_ee0,&local_1010,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1010._M_dataplus._M_p != &local_1010.field_2) {
    operator_delete(local_1010._M_dataplus._M_p,local_1010.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fd0._M_dataplus._M_p != &local_fd0.field_2) {
    operator_delete(local_fd0._M_dataplus._M_p,local_fd0.field_2._M_allocated_capacity + 1);
  }
  if (inFontReference == (PDFUsedFont *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Failed to create font object for arial.ttf\n",0x2b);
    goto LAB_001513eb;
  }
  pPVar7 = PDFWriter::StartPageContentContext(&local_ee0,pPVar6);
  if (pPVar7 == (PageContentContext *)0x0) {
    lVar8 = 0x2a;
    pcVar11 = "failed to create content context for page\n";
  }
  else {
    AbstractContentContext::q(&pPVar7->super_AbstractContentContext);
    AbstractContentContext::k(&pPVar7->super_AbstractContentContext,100.0,0.0,0.0,0.0);
    AbstractContentContext::re(&pPVar7->super_AbstractContentContext,100.0,500.0,100.0,100.0);
    AbstractContentContext::f(&pPVar7->super_AbstractContentContext);
    AbstractContentContext::Q(&pPVar7->super_AbstractContentContext);
    pPVar10 = pPVar7;
    EVar3 = PDFWriter::PausePageContentContext(&local_ee0,pPVar7);
    if (EVar3 == eSuccess) {
      AbstractContentContext::q(&pPVar7->super_AbstractContentContext);
      AbstractContentContext::k(&pPVar7->super_AbstractContentContext,0.0,100.0,100.0,0.0);
      AbstractContentContext::re(&pPVar7->super_AbstractContentContext,200.0,600.0,200.0,100.0);
      AbstractContentContext::f(&pPVar7->super_AbstractContentContext);
      AbstractContentContext::Q(&pPVar7->super_AbstractContentContext);
      AbstractContentContext::q(&pPVar7->super_AbstractContentContext);
      AbstractContentContext::G(&pPVar7->super_AbstractContentContext,0.5);
      AbstractContentContext::w(&pPVar7->super_AbstractContentContext,3.0);
      AbstractContentContext::m
                (&pPVar7->super_AbstractContentContext,pPVar10,extraout_EDX,&pLVar4->ShouldLog,iVar9
                 ,in_R9D);
      AbstractContentContext::l(&pPVar7->super_AbstractContentContext,400.0,400.0);
      AbstractContentContext::S(&pPVar7->super_AbstractContentContext);
      AbstractContentContext::Q(&pPVar7->super_AbstractContentContext);
      AbstractContentContext::BT(&pPVar7->super_AbstractContentContext);
      AbstractContentContext::k(&pPVar7->super_AbstractContentContext,0.0,0.0,0.0,1.0);
      AbstractContentContext::Tf(&pPVar7->super_AbstractContentContext,inFontReference,1.0);
      AbstractContentContext::Tm
                (&pPVar7->super_AbstractContentContext,30.0,0.0,0.0,30.0,78.4252,662.8997);
      pcVar2 = local_fb0 + 0x10;
      local_fb0._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_fb0,"hello world","");
      EVar3 = AbstractContentContext::Tj(&pPVar7->super_AbstractContentContext,(string *)local_fb0);
      if ((pointer)local_fb0._0_8_ != pcVar2) {
        operator_delete((void *)local_fb0._0_8_,(ulong)(local_fb0._16_8_ + 1));
      }
      if (EVar3 != eSuccess) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Could not find some of the glyphs for this font",0x2f);
      }
      AbstractContentContext::ET(&pPVar7->super_AbstractContentContext);
      EVar3 = PDFWriter::EndPageContentContext(&local_ee0,pPVar7);
      if (EVar3 == eSuccess) {
        EVar3 = PDFWriter::WritePageAndRelease(&local_ee0,pPVar6);
        if (EVar3 == eSuccess) {
          local_ff0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_ff0,"ShutDownRestartState.txt","");
          BuildRelativeOutputPath((string *)local_fb0,(char **)argv[2],&local_ff0);
          EVar3 = PDFWriter::Shutdown(&local_ee0,(string *)local_fb0);
          if ((pointer)local_fb0._0_8_ != pcVar2) {
            operator_delete((void *)local_fb0._0_8_,(ulong)(local_fb0._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_ff0._M_dataplus._M_p != paVar1) {
            operator_delete(local_ff0._M_dataplus._M_p,local_ff0.field_2._M_allocated_capacity + 1);
          }
          if (EVar3 == eSuccess) {
            PDFWriter::~PDFWriter(&local_ee0);
            PDFWriter::PDFWriter(&local_ee0);
            local_ff0._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_ff0,"SimpleContentShutdownRestart.pdf","");
            BuildRelativeOutputPath((string *)local_fb0,(char **)argv[2],&local_ff0);
            local_fd0._M_dataplus._M_p = (pointer)&local_fd0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_fd0,"ShutDownRestartState.txt","");
            BuildRelativeOutputPath(&local_1010,(char **)argv[2],&local_fd0);
            local_f50._M_dataplus._M_p = (pointer)&local_f50.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_f50,"");
            pLVar4 = LogConfiguration::DefaultLogConfiguration();
            inOptionalModifiedFile = &local_f50;
            EVar3 = PDFWriter::ContinuePDF
                              (&local_ee0,(string *)local_fb0,&local_1010,inOptionalModifiedFile,
                               pLVar4);
            iVar9 = (int)pLVar4;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f50._M_dataplus._M_p != &local_f50.field_2) {
              operator_delete(local_f50._M_dataplus._M_p,local_f50.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1010._M_dataplus._M_p != &local_1010.field_2) {
              operator_delete(local_1010._M_dataplus._M_p,
                              local_1010.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_fd0._M_dataplus._M_p != &local_fd0.field_2) {
              operator_delete(local_fd0._M_dataplus._M_p,local_fd0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((pointer)local_fb0._0_8_ != pcVar2) {
              operator_delete((void *)local_fb0._0_8_,(ulong)(local_fb0._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ff0._M_dataplus._M_p != paVar1) {
              operator_delete(local_ff0._M_dataplus._M_p,local_ff0.field_2._M_allocated_capacity + 1
                             );
            }
            if (EVar3 != eSuccess) {
              iVar9 = 1;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"failed to restart library\n",0x1a);
              goto LAB_0015167d;
            }
            pPVar6 = (PDFPage *)operator_new(0x2b8);
            PDFPage::PDFPage(pPVar6);
            PDFRectangle::PDFRectangle((PDFRectangle *)local_fb0,0.0,0.0,595.0,842.0);
            PDFPage::SetMediaBox(pPVar6,(PDFRectangle *)local_fb0);
            PDFRectangle::~PDFRectangle((PDFRectangle *)local_fb0);
            pPVar7 = PDFWriter::StartPageContentContext(&local_ee0,pPVar6);
            if (pPVar7 == (PageContentContext *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"failed to create content context for page\n",0x2a);
            }
            AbstractContentContext::q(&pPVar7->super_AbstractContentContext);
            AbstractContentContext::k(&pPVar7->super_AbstractContentContext,100.0,0.0,0.0,0.0);
            AbstractContentContext::re
                      (&pPVar7->super_AbstractContentContext,100.0,500.0,100.0,100.0);
            AbstractContentContext::f(&pPVar7->super_AbstractContentContext);
            AbstractContentContext::Q(&pPVar7->super_AbstractContentContext);
            EVar3 = PDFWriter::PausePageContentContext(&local_ee0,pPVar7);
            if (EVar3 != eSuccess) {
              iVar9 = 1;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"failed to pause page content context\n",0x25);
              goto LAB_0015167d;
            }
            PDFRectangle::PDFRectangle((PDFRectangle *)local_fb0,0.0,0.0,200.0,100.0);
            this = PDFWriter::StartFormXObject(&local_ee0,(PDFRectangle *)local_fb0,(double *)0x0);
            PDFRectangle::~PDFRectangle((PDFRectangle *)local_fb0);
            if (this == (PDFFormXObject *)0x0) {
              iVar9 = 1;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"failed to create form xobject\n",0x1e);
              goto LAB_0015167d;
            }
            inFormXObjectID = PDFFormXObject::GetObjectID(this);
            this_00 = PDFFormXObject::GetContentContext(this);
            AbstractContentContext::q(&this_00->super_AbstractContentContext);
            AbstractContentContext::k(&this_00->super_AbstractContentContext,0.0,100.0,100.0,0.0);
            AbstractContentContext::re(&this_00->super_AbstractContentContext,0.0,0.0,200.0,100.0);
            AbstractContentContext::f(&this_00->super_AbstractContentContext);
            AbstractContentContext::Q(&this_00->super_AbstractContentContext);
            EVar3 = PDFWriter::EndFormXObjectAndRelease(&local_ee0,this);
            if (EVar3 != eSuccess) {
              iVar9 = 1;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"failed to write XObject form\n",0x1d);
              goto LAB_0015167d;
            }
            this_01 = PDFPage::GetResourcesDictionary(pPVar6);
            ResourcesDictionary::AddFormXObjectMapping_abi_cxx11_
                      ((string *)local_fb0,this_01,inFormXObjectID);
            AbstractContentContext::q(&pPVar7->super_AbstractContentContext);
            AbstractContentContext::cm
                      (&pPVar7->super_AbstractContentContext,1.0,0.0,0.0,1.0,200.0,600.0);
            inXObjectName = (string *)local_fb0;
            AbstractContentContext::Do(&pPVar7->super_AbstractContentContext,inXObjectName);
            AbstractContentContext::Q(&pPVar7->super_AbstractContentContext);
            AbstractContentContext::q(&pPVar7->super_AbstractContentContext);
            AbstractContentContext::G(&pPVar7->super_AbstractContentContext,0.5);
            AbstractContentContext::w(&pPVar7->super_AbstractContentContext,3.0);
            AbstractContentContext::m
                      (&pPVar7->super_AbstractContentContext,inXObjectName,extraout_EDX_00,
                       (char *)inOptionalModifiedFile,iVar9,in_R9D);
            AbstractContentContext::l(&pPVar7->super_AbstractContentContext,400.0,400.0);
            AbstractContentContext::S(&pPVar7->super_AbstractContentContext);
            AbstractContentContext::Q(&pPVar7->super_AbstractContentContext);
            AbstractContentContext::q(&pPVar7->super_AbstractContentContext);
            AbstractContentContext::cm
                      (&pPVar7->super_AbstractContentContext,1.0,0.0,0.0,1.0,200.0,200.0);
            AbstractContentContext::Do(&pPVar7->super_AbstractContentContext,(string *)local_fb0);
            AbstractContentContext::Q(&pPVar7->super_AbstractContentContext);
            EVar3 = PDFWriter::EndPageContentContext(&local_ee0,pPVar7);
            if (EVar3 == eSuccess) {
              EVar3 = PDFWriter::WritePageAndRelease(&local_ee0,pPVar6);
              if (EVar3 != eSuccess) {
                lVar8 = 0x15;
                pcVar11 = "failed to write page\n";
                goto LAB_001518f9;
              }
              EVar3 = PDFWriter::EndPDF(&local_ee0);
              if (EVar3 != eSuccess) {
                lVar8 = 0x12;
                pcVar11 = "failed in end PDF\n";
                goto LAB_001518f9;
              }
              iVar9 = 0;
            }
            else {
              lVar8 = 0x23;
              pcVar11 = "failed to end page content context\n";
LAB_001518f9:
              iVar9 = 1;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,pcVar11,lVar8);
            }
            if ((pointer)local_fb0._0_8_ != pcVar2) {
              operator_delete((void *)local_fb0._0_8_,(ulong)(local_fb0._16_8_ + 1));
            }
LAB_0015167d:
            PDFWriter::~PDFWriter(&local_ee0);
            return iVar9;
          }
          lVar8 = 0x1b;
          pcVar11 = "failed to shutdown library\n";
        }
        else {
          lVar8 = 0x15;
          pcVar11 = "failed to write page\n";
        }
      }
      else {
        lVar8 = 0x23;
        pcVar11 = "failed to end page content context\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,lVar8);
      goto LAB_001513eb;
    }
    lVar8 = 0x25;
    pcVar11 = "failed to pause page content context\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,lVar8);
LAB_001513eb:
  PDFWriter::~PDFWriter(&local_ee0);
  return 1;
}

Assistant:

int ShutDownRestartTest(int argc, char* argv[])
{
	EStatusCode status; 

	do
	{
		{
			PDFWriter pdfWriterA;
			status = pdfWriterA.StartPDF(BuildRelativeOutputPath(argv,"SimpleContentShutdownRestart.pdf"),ePDFVersion13);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to start PDF\n";
				break;
			}	

			PDFPage* page = new PDFPage();
			page->SetMediaBox(PDFRectangle(0,0,595,842));

			PDFUsedFont* font = pdfWriterA.GetFontForFile(BuildRelativeInputPath(argv,"fonts/arial.ttf"));
			if(!font)
			{
				status = PDFHummus::eFailure;
				cout<<"Failed to create font object for arial.ttf\n";
				break;
			}

			PageContentContext* contentContext = pdfWriterA.StartPageContentContext(page);
			if(NULL == contentContext)
			{
				status = PDFHummus::eFailure;
				cout<<"failed to create content context for page\n";
				break;
			}

			// draw a 100X100 points cyan square
			contentContext->q();
			contentContext->k(100,0,0,0);
			contentContext->re(100,500,100,100);
			contentContext->f();
			contentContext->Q();

			// force stream change
			status = pdfWriterA.PausePageContentContext(contentContext);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to pause page content context\n";
				break;
			}

			// draw a 200X100 points red rectangle
			contentContext->q();
			contentContext->k(0,100,100,0);
			contentContext->re(200,600,200,100);
			contentContext->f();
			contentContext->Q();

			// draw a gray line
			contentContext->q();
			contentContext->G(0.5);
			contentContext->w(3);
			contentContext->m(200,600);
			contentContext->l(400,400);
			contentContext->S();
			contentContext->Q();

			// Draw some text
			contentContext->BT();
			contentContext->k(0,0,0,1);
			contentContext->Tf(font,1);
			contentContext->Tm(30,0,0,30,78.4252,662.8997);

			EStatusCode encodingStatus = contentContext->Tj("hello world");
			if(encodingStatus != PDFHummus::eSuccess)
				cout<<"Could not find some of the glyphs for this font";

			// continue even if failed...want to see how it looks like
			contentContext->ET();
				
			status = pdfWriterA.EndPageContentContext(contentContext);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to end page content context\n";
				break;
			}

			status = pdfWriterA.WritePageAndRelease(page);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to write page\n";
				break;
			}


			status = pdfWriterA.Shutdown(BuildRelativeOutputPath(argv,"ShutDownRestartState.txt"));
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to shutdown library\n";
				break;
			}

		}
		{
			PDFWriter pdfWriterB;
			status = pdfWriterB.ContinuePDF(
                            BuildRelativeOutputPath(argv,"SimpleContentShutdownRestart.pdf"),
                            BuildRelativeOutputPath(argv,"ShutDownRestartState.txt")
                    );
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to restart library\n";
				break;
			}	

			PDFPage* page = new PDFPage();
			page->SetMediaBox(PDFRectangle(0,0,595,842));

			PageContentContext* pageContentContext = pdfWriterB.StartPageContentContext(page);
			if(NULL == pageContentContext)
			{
				status = PDFHummus::eFailure;
				cout<<"failed to create content context for page\n";
			}

			// draw a 100X100 points cyan square
			pageContentContext->q();
			pageContentContext->k(100,0,0,0);
			pageContentContext->re(100,500,100,100);
			pageContentContext->f();
			pageContentContext->Q();

			// pause stream to start writing a form xobject
			status = pdfWriterB.PausePageContentContext(pageContentContext);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to pause page content context\n";
				break;
			}

			// define an xobject form to draw a 200X100 points red rectangle
			PDFFormXObject* xobjectForm = pdfWriterB.StartFormXObject(PDFRectangle(0,0,200,100));
			if(!xobjectForm)
			{
				status = PDFHummus::eFailure;
				cout<<"failed to create form xobject\n";
				break;
			}
			ObjectIDType formObjectID = xobjectForm->GetObjectID();

			XObjectContentContext* xobjectContentContext = xobjectForm->GetContentContext();
			xobjectContentContext->q();
			xobjectContentContext->k(0,100,100,0);
			xobjectContentContext->re(0,0,200,100);
			xobjectContentContext->f();
			xobjectContentContext->Q();

			status = pdfWriterB.EndFormXObjectAndRelease(xobjectForm);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to write XObject form\n";
				break;
			}

			string formXObjectName = page->GetResourcesDictionary().AddFormXObjectMapping(formObjectID);

			// continue page drawing, place the form in 200,600
			pageContentContext->q();
			pageContentContext->cm(1,0,0,1,200,600);
			pageContentContext->Do(formXObjectName);
			pageContentContext->Q();

			// draw a gray line
			pageContentContext->q();
			pageContentContext->G(0.5);
			pageContentContext->w(3);
			pageContentContext->m(200,600);
			pageContentContext->l(400,400);
			pageContentContext->S();
			pageContentContext->Q();

			// place the form in another location
			pageContentContext->q();
			pageContentContext->cm(1,0,0,1,200,200);
			pageContentContext->Do(formXObjectName);
			pageContentContext->Q();

			status = pdfWriterB.EndPageContentContext(pageContentContext);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to end page content context\n";
				break;
			}

			status = pdfWriterB.WritePageAndRelease(page);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to write page\n";
				break;
			}

			status = pdfWriterB.EndPDF();
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed in end PDF\n";
				break;
			}
		}
	}while(false);
	return status == eSuccess ? 0:1;

}